

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

float64 float32_to_float64_ppc64(float32 a,float_status *s)

{
  ulong uVar1;
  uint64_t uVar2;
  float64 fVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  double dVar7;
  FloatParts FVar8;
  
  if (((a >> 0x17) + 1 & 0xfe) == 0) {
    if ((a & 0x7fffffff) != 0) {
      FVar8 = float32_unpack_raw(a);
      FVar8 = sf_canonicalize(FVar8,&float32_params,s);
      uVar1 = FVar8.frac;
      if (float_class_inf < FVar8.cls) {
        if (FVar8.cls == float_class_snan) {
          s->float_exception_flags = s->float_exception_flags | 1;
          uVar4 = FVar8._8_8_ & 0xffffff00ffffffff | 0x400000000;
          FVar8.exp = (int)uVar4;
          FVar8.cls = (char)(uVar4 >> 0x20);
          FVar8.sign = (_Bool)(char)(uVar4 >> 0x28);
          FVar8._14_2_ = (short)(uVar4 >> 0x30);
          FVar8.frac = uVar1 | 0x2000000000000000;
        }
        uVar5 = FVar8._8_8_;
        uVar2 = FVar8.frac;
        bVar6 = s->default_nan_mode != '\0';
        if (bVar6) {
          uVar2 = 0x2000000000000000;
        }
        FVar8.exp = (int)uVar5;
        FVar8.cls = (char)((ulong)uVar5 >> 0x20);
        FVar8.sign = (_Bool)(char)((ulong)uVar5 >> 0x28);
        FVar8._14_2_ = (short)((ulong)uVar5 >> 0x30);
        FVar8.frac = uVar2;
        if (bVar6) {
          FVar8.exp = 0x7fffffff;
          FVar8.cls = float_class_qnan;
          FVar8.sign = false;
          FVar8._14_2_ = 0;
        }
      }
      FVar8 = round_canonical(FVar8,s,&float64_params);
      fVar3 = float64_pack_raw(FVar8);
      return fVar3;
    }
    dVar7 = (double)((ulong)(a >> 0x1f) << 0x3f);
  }
  else {
    dVar7 = (double)(float)a;
  }
  return (float64)dVar7;
}

Assistant:

static inline bool float32_is_normal(float32 a)
{
    return (((float32_val(a) >> 23) + 1) & 0xff) >= 2;
}